

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O1

If_LibLut_t * If_LibLutRead(char *FileName)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  If_LibLut_t *__s;
  size_t sVar4;
  char *__dest;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float (*pafVar9) [33];
  double dVar10;
  char pBuffer [1000];
  char local_418 [1000];
  
  __stream = fopen(FileName,"r");
  if (__stream == (FILE *)0x0) {
    __s = (If_LibLut_t *)0x0;
    Abc_Print(-1,"Cannot open LUT library file \"%s\".\n",FileName);
  }
  else {
    __s = (If_LibLut_t *)malloc(0x1198);
    __dest = (char *)0x0;
    memset(__s,0,0x1198);
    if (FileName != (char *)0x0) {
      sVar4 = strlen(FileName);
      __dest = (char *)malloc(sVar4 + 1);
      strcpy(__dest,FileName);
    }
    __s->pName = __dest;
    pcVar5 = fgets(local_418,1000,__stream);
    if (pcVar5 == (char *)0x0) {
      uVar7 = 1;
    }
    else {
      pafVar9 = __s->pLutDelays + 1;
      uVar7 = 1;
      do {
        pcVar5 = strtok(local_418," \t\n");
        if ((pcVar5 == (char *)0x0) || (*pcVar5 == '#')) {
          pcVar5 = fgets(local_418,1000,__stream);
        }
        else {
          uVar3 = atoi(pcVar5);
          if (uVar7 != uVar3) {
            Abc_Print(1,"Error in the LUT library file \"%s\".\n",FileName);
            if (__dest != (char *)0x0) {
              free(__dest);
              __s->pName = (char *)0x0;
            }
            free(__s);
            fclose(__stream);
            return (If_LibLut_t *)0x0;
          }
          uVar6 = 0;
          pcVar5 = strtok((char *)0x0," \t\n");
          dVar10 = atof(pcVar5);
          __s->pLutAreas[uVar7] = (float)dVar10;
          pcVar5 = strtok((char *)0x0," \t\n");
          if (pcVar5 != (char *)0x0) {
            uVar6 = 0;
            do {
              dVar10 = atof(pcVar5);
              (*pafVar9)[uVar6] = (float)dVar10;
              uVar6 = uVar6 + 1;
              pcVar5 = strtok((char *)0x0," \t\n");
            } while (pcVar5 != (char *)0x0);
          }
          if ((long)uVar7 < (long)(int)(uint)uVar6) {
            if (__dest != (char *)0x0) {
              free(__dest);
              __s->pName = (char *)0x0;
            }
            free(__s);
            Abc_Print(1,"LUT %d has too many pins (%d). Max allowed is %d.\n",uVar7 & 0xffffffff,
                      uVar6 & 0xffffffff,uVar7 & 0xffffffff);
LAB_00400f04:
            fclose(__stream);
            return (If_LibLut_t *)0x0;
          }
          if (1 < (uint)uVar6) {
            __s->fVarPinDelays = 1;
          }
          if (uVar7 == 0x20) {
            if (__dest != (char *)0x0) {
              free(__dest);
              __s->pName = (char *)0x0;
            }
            free(__s);
            Abc_Print(1,"Skipping LUTs of size more than %d.\n",0x20);
            goto LAB_00400f04;
          }
          uVar7 = uVar7 + 1;
          pcVar5 = fgets(local_418,1000,__stream);
          pafVar9 = pafVar9 + 1;
        }
      } while (pcVar5 != (char *)0x0);
    }
    iVar2 = (int)uVar7;
    __s->LutMax = iVar2 + -1;
    if (__s->fVarPinDelays == 0) {
      if (1 < iVar2) {
        pafVar9 = __s->pLutDelays;
        uVar6 = 1;
        do {
          pafVar9 = pafVar9 + 1;
          if ((*pafVar9)[0] <= 0.0) {
            Abc_Print(0,
                      "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                      ,(double)(*pafVar9)[0],uVar6 & 0xffffffff);
          }
          uVar6 = uVar6 + 1;
        } while ((uVar7 & 0xffffffff) != uVar6);
      }
    }
    else if (1 < iVar2) {
      pafVar9 = __s->pLutDelays;
      uVar6 = 1;
      do {
        pafVar9 = pafVar9 + 1;
        uVar8 = 0;
        do {
          fVar1 = (*pafVar9)[uVar8];
          if (fVar1 <= 0.0) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                      ,(double)fVar1,uVar8 & 0xffffffff,uVar6 & 0xffffffff);
          }
          if ((uVar8 != 0) && (fVar1 < pafVar9[-1][uVar8 + 0x20])) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n"
                      ,(double)pafVar9[-1][uVar8 + 0x20],(double)fVar1,(ulong)((int)uVar8 - 1),
                      uVar6 & 0xffffffff,uVar8 & 0xffffffff,uVar6 & 0xffffffff);
          }
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uVar7 & 0xffffffff));
    }
    fclose(__stream);
  }
  return __s;
}

Assistant:

If_LibLut_t * If_LibLutRead( char * FileName )
{
    char pBuffer[1000], * pToken;
    If_LibLut_t * p;
    FILE * pFile;
    int i, k;

    pFile = fopen( FileName, "r" );
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open LUT library file \"%s\".\n", FileName );
        return NULL;
    }

    p = ABC_ALLOC( If_LibLut_t, 1 );
    memset( p, 0, sizeof(If_LibLut_t) );
    p->pName = Abc_UtilStrsav( FileName );

    i = 1;
    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        if ( i != atoi(pToken) )
        {
            Abc_Print( 1, "Error in the LUT library file \"%s\".\n", FileName );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            fclose( pFile );
            return NULL;
        }

        // read area
        pToken = strtok( NULL, " \t\n" );
        p->pLutAreas[i] = (float)atof(pToken);

        // read delays
        k = 0;
        while ( (pToken = strtok( NULL, " \t\n" )) )
            p->pLutDelays[i][k++] = (float)atof(pToken);

        // check for out-of-bound
        if ( k > i )
        {
            ABC_FREE( p->pName );
            ABC_FREE( p );
            Abc_Print( 1, "LUT %d has too many pins (%d). Max allowed is %d.\n", i, k, i );
            fclose( pFile );
            return NULL;
        }

        // check if var delays are specified
        if ( k > 1 )
            p->fVarPinDelays = 1;

        if ( i == IF_MAX_LUTSIZE )
        {
            ABC_FREE( p->pName );
            ABC_FREE( p );
            Abc_Print( 1, "Skipping LUTs of size more than %d.\n", i );
            fclose( pFile );
            return NULL;
        }
        i++;
    }
    p->LutMax = i-1;

    // check the library
    if ( p->fVarPinDelays )
    {
        for ( i = 1; i <= p->LutMax; i++ )
            for ( k = 0; k < i; k++ )
            {
                if ( p->pLutDelays[i][k] <= 0.0 )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                        k, i, p->pLutDelays[i][k] );
                if ( k && p->pLutDelays[i][k-1] > p->pLutDelays[i][k] )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n", 
                        k-1, i, p->pLutDelays[i][k-1], 
                        k, i, p->pLutDelays[i][k] );
            }
    }
    else
    {
        for ( i = 1; i <= p->LutMax; i++ )
        {
            if ( p->pLutDelays[i][0] <= 0.0 )
                Abc_Print( 0, "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                    i, p->pLutDelays[i][0] );
        }
    }

    fclose( pFile );
    return p;
}